

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O0

void __thiscall E64::host_t::video_change_scanlines_intensity(host_t *this)

{
  long in_RDI;
  
  if (*(byte *)(*(long *)(in_RDI + 0xd8) + 0x252) < 0x40) {
    *(undefined1 *)(*(long *)(in_RDI + 0xd8) + 0x252) = 0x40;
  }
  else if (*(byte *)(*(long *)(in_RDI + 0xd8) + 0x252) < 0x80) {
    *(undefined1 *)(*(long *)(in_RDI + 0xd8) + 0x252) = 0x80;
  }
  else if (*(byte *)(*(long *)(in_RDI + 0xd8) + 0x252) < 0xc0) {
    *(undefined1 *)(*(long *)(in_RDI + 0xd8) + 0x252) = 0xc0;
  }
  else if (*(byte *)(*(long *)(in_RDI + 0xd8) + 0x252) < 0xff) {
    *(undefined1 *)(*(long *)(in_RDI + 0xd8) + 0x252) = 0xff;
  }
  else {
    *(undefined1 *)(*(long *)(in_RDI + 0xd8) + 0x252) = 0;
  }
  hud_t::show_notification
            (*(hud_t **)(in_RDI + 0xd0),"Scanlines alpha value = %3u",
             (ulong)*(byte *)(*(long *)(in_RDI + 0xd8) + 0x252));
  return;
}

Assistant:

void E64::host_t::video_change_scanlines_intensity()
{
	if (settings->video_scanlines_alpha < 64) {
		settings->video_scanlines_alpha = 64;
	} else if (settings->video_scanlines_alpha < 128) {
		settings->video_scanlines_alpha = 128;
	} else if (settings->video_scanlines_alpha < 192) {
		settings->video_scanlines_alpha = 192;
	} else if (settings->video_scanlines_alpha < 255) {
		settings->video_scanlines_alpha = 255;
	} else {
		settings->video_scanlines_alpha = 0;
	}
	hud->show_notification("Scanlines alpha value = %3u", settings->video_scanlines_alpha);
}